

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_columns.cpp
# Opt level: O0

void __thiscall
duckdb::ColumnHelper::WriteColumns
          (ColumnHelper *this,idx_t start_index,idx_t start_col,idx_t end_col,DataChunk *output)

{
  bool bVar1;
  LogicalTypeId LVar2;
  string *psVar3;
  string *psVar4;
  ulong in_RCX;
  ulong in_RDX;
  long in_RSI;
  long *in_RDI;
  Value numeric_precision_radix;
  Value numeric_scale;
  Value numeric_precision;
  LogicalType *type;
  idx_t col;
  StandardEntry *entry;
  idx_t index;
  idx_t i;
  Value *in_stack_ffffffffffffefd8;
  Value *in_stack_ffffffffffffefe0;
  LogicalType *in_stack_ffffffffffffefe8;
  DataChunk *in_stack_ffffffffffffeff0;
  undefined1 *in_stack_ffffffffffffeff8;
  LogicalType *in_stack_fffffffffffff000;
  undefined1 *in_stack_fffffffffffff018;
  int32_t iVar5;
  string *in_stack_fffffffffffff058;
  Value *in_stack_fffffffffffff060;
  Value local_ce8;
  Value local_c90 [2];
  LogicalType local_c10 [2];
  DataChunk local_bd0 [2];
  undefined1 local_b50 [64];
  LogicalType local_b10 [10];
  LogicalType *in_stack_fffffffffffff5e8;
  undefined1 local_9d0 [768];
  string local_6d0 [2];
  Value local_690 [9];
  string local_440 [96];
  LogicalType *local_3e0;
  undefined1 local_398 [128];
  undefined1 local_318 [128];
  string local_298 [160];
  string local_1f8 [160];
  string local_158 [176];
  string local_a8 [96];
  long local_48;
  long local_40;
  long local_38;
  ulong local_30;
  ulong local_20;
  ulong local_18;
  long local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_30 = in_RDX; local_30 < local_20; local_30 = local_30 + 1) {
    local_38 = local_10 + (local_30 - local_18);
    local_40 = (**(code **)(*in_RDI + 0x10))();
    local_48 = 1;
    psVar3 = Catalog::GetName_abi_cxx11_((Catalog *)0x1401e3f);
    ::std::__cxx11::string::string(local_a8,(string *)psVar3);
    Value::Value(in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    ::std::__cxx11::string::~string(local_a8);
    local_48 = local_48 + 1;
    Catalog::GetOid((Catalog *)0x1401efe);
    NumericCast<long,unsigned_long,void>(0x1401f06);
    Value::BIGINT((int64_t)in_stack_fffffffffffff018);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    ::std::__cxx11::string::string(local_158,(string *)(*(long *)(local_40 + 0xe0) + 0x20));
    Value::Value(in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    ::std::__cxx11::string::~string(local_158);
    local_48 = local_48 + 1;
    NumericCast<long,unsigned_long,void>(0x1402060);
    Value::BIGINT((int64_t)in_stack_fffffffffffff018);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    ::std::__cxx11::string::string(local_1f8,(string *)(local_40 + 0x20));
    Value::Value(in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    ::std::__cxx11::string::~string(local_1f8);
    local_48 = local_48 + 1;
    NumericCast<long,unsigned_long,void>(0x14021ac);
    Value::BIGINT((int64_t)in_stack_fffffffffffff018);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    psVar4 = (string *)(**(code **)(*in_RDI + 0x20))(in_RDI,local_30);
    ::std::__cxx11::string::string(local_298,psVar4);
    Value::Value(in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    ::std::__cxx11::string::~string(local_298);
    local_48 = local_48 + 1;
    UnsafeNumericCast<int,unsigned_long,void>(local_30 + 1);
    Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    (**(code **)(*in_RDI + 0x40))(local_318,in_RDI,local_30);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    Value::BOOLEAN(SUB81((ulong)in_stack_fffffffffffff018 >> 0x38,0));
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    (**(code **)(*in_RDI + 0x30))(local_398,in_RDI,local_30);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_48 = local_48 + 1;
    (**(code **)(*in_RDI + 0x38))(in_RDI,local_30);
    Value::BOOLEAN(SUB81((ulong)in_stack_fffffffffffff018 >> 0x38,0));
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    local_3e0 = (LogicalType *)(**(code **)(*in_RDI + 0x28))(in_RDI,local_30);
    local_48 = local_48 + 1;
    LogicalType::ToString_abi_cxx11_(in_stack_fffffffffffff5e8);
    Value::Value(in_stack_fffffffffffff060,in_stack_fffffffffffff058);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    ::std::__cxx11::string::~string(local_440);
    local_48 = local_48 + 1;
    LogicalType::id(local_3e0);
    Value::BIGINT((int64_t)in_stack_fffffffffffff018);
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    LogicalType::LogicalType
              (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38));
    bVar1 = LogicalType::operator==(in_stack_ffffffffffffefe8,&in_stack_ffffffffffffefe0->type_);
    LogicalType::~LogicalType((LogicalType *)0x1402771);
    LVar2 = (LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38);
    if (bVar1) {
      local_48 = local_48 + 1;
      LogicalType::LogicalType(in_stack_fffffffffffff000,LVar2);
      Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                          (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      LogicalType::~LogicalType((LogicalType *)0x140282e);
    }
    else {
      local_48 = local_48 + 1;
      LogicalType::LogicalType(in_stack_fffffffffffff000,LVar2);
      Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                          (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      LogicalType::~LogicalType((LogicalType *)0x1402c12);
    }
    LogicalType::LogicalType
              (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38));
    Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    LogicalType::~LogicalType((LogicalType *)0x1402c9b);
    LogicalType::LogicalType
              (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38));
    Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    LogicalType::~LogicalType((LogicalType *)0x1402cd3);
    LogicalType::LogicalType
              (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38));
    Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
    LogicalType::~LogicalType((LogicalType *)0x1402d0b);
    LVar2 = LogicalType::id(local_3e0);
    iVar5 = (int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20);
    switch(LVar2) {
    case TINYINT:
      Value::INTEGER(iVar5);
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    case SMALLINT:
      Value::INTEGER(iVar5);
      iVar5 = (int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20);
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER(iVar5);
      in_stack_fffffffffffff018 = local_9d0;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    case INTEGER:
      Value::INTEGER(iVar5);
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    case BIGINT:
      Value::INTEGER(iVar5);
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    default:
      LogicalType::LogicalType
                (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38)
                );
      Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      in_stack_ffffffffffffefe0 = local_c90;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      LogicalType::~LogicalType((LogicalType *)0x14033f3);
      LogicalType::LogicalType
                (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38)
                );
      Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      in_stack_ffffffffffffefd8 = &local_ce8;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      LogicalType::~LogicalType((LogicalType *)0x140344d);
      LogicalType::LogicalType
                (in_stack_fffffffffffff000,(LogicalTypeId)((ulong)in_stack_ffffffffffffeff8 >> 0x38)
                );
      Value::Value((Value *)in_stack_ffffffffffffeff0,in_stack_ffffffffffffefe8);
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      LogicalType::~LogicalType((LogicalType *)0x14034a7);
      break;
    case DECIMAL:
      DecimalType::GetWidth(&in_stack_ffffffffffffefe0->type_);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      in_stack_fffffffffffff060 = local_690;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      DecimalType::GetScale(&in_stack_ffffffffffffefe0->type_);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      in_stack_fffffffffffff058 = local_6d0;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    case FLOAT:
      Value::INTEGER(iVar5);
      in_stack_fffffffffffff000 = local_b10;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      in_stack_ffffffffffffeff8 = local_b50;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    case DOUBLE:
      Value::INTEGER(iVar5);
      in_stack_ffffffffffffeff0 = local_bd0;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      in_stack_ffffffffffffefe8 = local_c10;
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      break;
    case HUGEINT:
      Value::INTEGER(iVar5);
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
      Value::INTEGER((int32_t)((ulong)in_stack_fffffffffffff018 >> 0x20));
      Value::operator=(in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
      Value::~Value(in_stack_ffffffffffffefe0);
    }
    local_48 = local_48 + 1;
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    local_48 = local_48 + 1;
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    local_48 = local_48 + 1;
    DataChunk::SetValue(in_stack_ffffffffffffeff0,(idx_t)in_stack_ffffffffffffefe8,
                        (idx_t)in_stack_ffffffffffffefe0,in_stack_ffffffffffffefd8);
    Value::~Value(in_stack_ffffffffffffefe0);
    Value::~Value(in_stack_ffffffffffffefe0);
    Value::~Value(in_stack_ffffffffffffefe0);
  }
  return;
}

Assistant:

void ColumnHelper::WriteColumns(idx_t start_index, idx_t start_col, idx_t end_col, DataChunk &output) {
	for (idx_t i = start_col; i < end_col; i++) {
		auto index = start_index + (i - start_col);
		auto &entry = Entry();

		idx_t col = 0;
		// database_name, VARCHAR
		output.SetValue(col++, index, entry.catalog.GetName());
		// database_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.catalog.GetOid())));
		// schema_name, VARCHAR
		output.SetValue(col++, index, entry.schema.name);
		// schema_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.schema.oid)));
		// table_name, VARCHAR
		output.SetValue(col++, index, entry.name);
		// table_oid, BIGINT
		output.SetValue(col++, index, Value::BIGINT(NumericCast<int64_t>(entry.oid)));
		// column_name, VARCHAR
		output.SetValue(col++, index, Value(ColumnName(i)));
		// column_index, INTEGER
		output.SetValue(col++, index, Value::INTEGER(UnsafeNumericCast<int32_t>(i + 1)));
		// comment, VARCHAR
		output.SetValue(col++, index, ColumnComment(i));
		// internal, BOOLEAN
		output.SetValue(col++, index, Value::BOOLEAN(entry.internal));
		// column_default, VARCHAR
		output.SetValue(col++, index, Value(ColumnDefault(i)));
		// is_nullable, BOOLEAN
		output.SetValue(col++, index, Value::BOOLEAN(IsNullable(i)));
		// data_type, VARCHAR
		const LogicalType &type = ColumnType(i);
		output.SetValue(col++, index, Value(type.ToString()));
		// data_type_id, BIGINT
		output.SetValue(col++, index, Value::BIGINT(int(type.id())));
		if (type == LogicalType::VARCHAR) {
			// FIXME: need check constraints in place to set this correctly
			// character_maximum_length, INTEGER
			output.SetValue(col++, index, Value());
		} else {
			// "character_maximum_length", PhysicalType::INTEGER
			output.SetValue(col++, index, Value());
		}

		Value numeric_precision, numeric_scale, numeric_precision_radix;
		switch (type.id()) {
		case LogicalTypeId::DECIMAL:
			numeric_precision = Value::INTEGER(DecimalType::GetWidth(type));
			numeric_scale = Value::INTEGER(DecimalType::GetScale(type));
			numeric_precision_radix = Value::INTEGER(10);
			break;
		case LogicalTypeId::HUGEINT:
			numeric_precision = Value::INTEGER(128);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::BIGINT:
			numeric_precision = Value::INTEGER(64);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::INTEGER:
			numeric_precision = Value::INTEGER(32);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::SMALLINT:
			numeric_precision = Value::INTEGER(16);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::TINYINT:
			numeric_precision = Value::INTEGER(8);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::FLOAT:
			numeric_precision = Value::INTEGER(24);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		case LogicalTypeId::DOUBLE:
			numeric_precision = Value::INTEGER(53);
			numeric_scale = Value::INTEGER(0);
			numeric_precision_radix = Value::INTEGER(2);
			break;
		default:
			numeric_precision = Value();
			numeric_scale = Value();
			numeric_precision_radix = Value();
			break;
		}

		// numeric_precision, INTEGER
		output.SetValue(col++, index, numeric_precision);
		// numeric_precision_radix, INTEGER
		output.SetValue(col++, index, numeric_precision_radix);
		// numeric_scale, INTEGER
		output.SetValue(col++, index, numeric_scale);
	}
}